

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8 *ptr,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  undefined4 in_ECX;
  uint in_ESI;
  long in_RDI;
  string *in_R8;
  undefined4 in_stack_ffffffffffffffc0;
  
  if (((uint)((InternalMetadata *)(in_RDI + (ulong)in_ESI))->ptr_ & 1) == 1) {
    InternalMetadata::
    PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
              ((InternalMetadata *)(in_RDI + (ulong)in_ESI));
  }
  else {
    GetEmptyString_abi_cxx11_();
  }
  io::CodedOutputStream::WriteString
            ((CodedOutputStream *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),in_R8);
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8* ptr, uint32 offset, uint32 tag,
                                uint32 has_offset,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}